

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scrubbers.cpp
# Opt level: O0

Scrubber *
ApprovalTests::Scrubbers::createRegexScrubber(regex *regexPattern,string *replacementText)

{
  regex *in_RDX;
  anon_class_32_1_a51d903f *in_RSI;
  Scrubber *in_RDI;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  *this;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  local_58;
  RegexReplacer *in_stack_ffffffffffffffe0;
  
  this = &local_58;
  ::std::__cxx11::string::string((string *)this,(string *)in_RDX);
  ::std::
  function<std::__cxx11::string(std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>const&)>
  ::
  function<ApprovalTests::Scrubbers::createRegexScrubber(std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>const&,std::__cxx11::string_const&)::__0,void>
            (this,in_RSI);
  createRegexScrubber(in_RDX,in_stack_ffffffffffffffe0);
  ::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
               *)0x1653d3);
  createRegexScrubber(std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>const&,std::__cxx11::string_const&)
  ::$_0::~__0((anon_class_32_1_a51d903f *)0x1653dd);
  return in_RDI;
}

Assistant:

Scrubber createRegexScrubber(const std::regex& regexPattern,
                                     const std::string& replacementText)
        {
            return createRegexScrubber(
                regexPattern, [=](const RegexMatch&) { return replacementText; });
        }